

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

double __thiscall crnlib::random::gaussian(random *this,double mean,double stddev)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double y;
  double x;
  double v;
  double u;
  double q;
  double stddev_local;
  double mean_local;
  random *this_local;
  
  do {
    v = drand(this,0.0,1.0);
    x = drand(this,0.0,1.0);
    if ((v <= 0.0) || (x <= 0.0)) {
      v = 1.0;
      x = 1.0;
    }
    dVar2 = (x - 0.5) * 1.7156;
    dVar3 = v - 0.449871;
    dVar3 = dVar3 * dVar3 +
            (ABS(dVar2) + 0.386595) * ((ABS(dVar2) + 0.386595) * 0.196 + -(dVar3 * 0.25472));
    if (dVar3 < 0.27597) break;
    bVar1 = true;
    if (dVar3 <= 0.27846) {
      dVar3 = log(v);
      bVar1 = dVar3 * -4.0 * v * v < dVar2 * dVar2;
    }
  } while (bVar1);
  return mean + (stddev * dVar2) / v;
}

Assistant:

double random::gaussian(double mean, double stddev)
    {
        double q, u, v, x, y;

        /*
            Generate P = (u,v) uniform in rect. enclosing acceptance region
            Make sure that any random numbers <= 0 are rejected, since
            gaussian() requires uniforms > 0, but RandomUniform() delivers >= 0.
            */
        do
        {
            u = drand(0, 1);
            v = drand(0, 1);
            if (u <= 0.0 || v <= 0.0)
            {
                u = 1.0;
                v = 1.0;
            }
            v = 1.7156 * (v - 0.5);

            /*  Evaluate the quadratic form */
            x = u - 0.449871;
            y = fabs(v) + 0.386595;
            q = x * x + y * (0.19600 * y - 0.25472 * x);

            /* Accept P if inside inner ellipse */
            if (q < 0.27597)
            {
                break;
            }

            /*  Reject P if outside outer ellipse, or outside acceptance region */
        } while ((q > 0.27846) || (v * v > -4.0 * log(u) * u * u));

        /*  Return ratio of P's coordinates as the normal deviate */
        return (mean + stddev * v / u);
    }